

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O0

void skiwi::print_last_global_variable_used
               (ostream *out,shared_ptr<skiwi::environment<skiwi::environment_entry>_> *env,
               repl_data *rd,context *p_ctxt)

{
  bool bVar1;
  element_type *peVar2;
  element_type *this;
  ostream *poVar3;
  reference ppVar4;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *q;
  const_iterator __end4;
  const_iterator __begin4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *__range4;
  uint64_t ind;
  stringstream local_258 [8];
  stringstream ss;
  ostream local_248 [376];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_b0 [8];
  string varname;
  undefined1 local_78 [8];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry>
  res;
  uint64_t pos;
  int stack_item;
  context *p_ctxt_local;
  repl_data *rd_local;
  shared_ptr<skiwi::environment<skiwi::environment_entry>_> *env_local;
  ostream *out_local;
  
  if ((p_ctxt != (context *)0x0) &&
     (peVar2 = std::
               __shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
               ::get(&env->
                      super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                    ), peVar2 != (element_type *)0x0)) {
    std::operator<<(out,"\ncall stack:\n");
    for (pos._4_4_ = 4; -1 < pos._4_4_; pos._4_4_ = pos._4_4_ + -1) {
      res.second.live_range.last = p_ctxt->last_global_variable_used[pos._4_4_];
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry>
                  *)local_78);
      this = std::
             __shared_ptr_access<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)env);
      bVar1 = environment<skiwi::environment_entry>::
              find_if<skiwi::print_last_global_variable_used(std::ostream&,std::shared_ptr<skiwi::environment<skiwi::environment_entry>>,skiwi::repl_data_const&,skiwi::context_const*)::__0>
                        (this,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry>
                               *)local_78,
                         (anon_class_8_1_ba1d6db4_for__M_pred)&res.second.live_range.last);
      if (bVar1) {
        varname.field_2._8_4_ = std::setw(4);
        poVar3 = std::operator<<(out,(_Setw)varname.field_2._8_4_);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,pos._4_4_);
        std::operator<<(poVar3,": ");
        get_variable_name_before_alpha((string *)local_b0,(string *)local_78);
        std::__cxx11::string::substr((ulong)&local_d0,(ulong)local_b0);
        bVar1 = std::operator==(&local_d0,"#%q");
        std::__cxx11::string::~string((string *)&local_d0);
        if (bVar1) {
          std::__cxx11::stringstream::stringstream(local_258);
          std::__cxx11::string::substr((ulong)&ind,(ulong)local_b0);
          std::operator<<(local_248,(string *)&ind);
          std::__cxx11::string::~string((string *)&ind);
          std::istream::operator>>((istream *)local_258,(ulong *)&__range4);
          __end4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                   ::begin(&rd->quote_to_index);
          q = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
               *)std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 ::end(&rd->quote_to_index);
          while (bVar1 = std::operator!=(&__end4,(_Self *)&q), bVar1) {
            ppVar4 = std::
                     _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                     ::operator*(&__end4);
            if ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 *)ppVar4->second == __range4) {
              poVar3 = std::operator<<(out,"(quote ");
              poVar3 = std::operator<<(poVar3,(string *)ppVar4);
              std::operator<<(poVar3,")\n");
            }
            std::
            _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
            ::operator++(&__end4);
          }
          std::__cxx11::stringstream::~stringstream(local_258);
        }
        else {
          poVar3 = std::operator<<(out,(string *)local_b0);
          std::operator<<(poVar3,"\n");
        }
        std::__cxx11::string::~string((string *)local_b0);
      }
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry>
               *)local_78);
    }
  }
  return;
}

Assistant:

void print_last_global_variable_used(std::ostream& out, std::shared_ptr<SKIWI::environment<SKIWI::environment_entry>> env, const repl_data& rd, const context* p_ctxt)
  {
  if (!p_ctxt)
    return;
  if (!env.get())
    return;

  out << "\ncall stack:\n";
  for (int stack_item = SKIWI_VARIABLE_DEBUG_STACK_SIZE - 1; stack_item >= 0; --stack_item)
    {
    uint64_t pos = p_ctxt->last_global_variable_used[stack_item];
    std::pair<std::string, SKIWI::environment_entry> res;
    if (env->find_if(res, [&](const std::pair<std::string, SKIWI::environment_entry>& v) { return v.second.pos == pos; }))
      {
      out << std::setw(4) << stack_item << ": ";
      std::string varname = get_variable_name_before_alpha(res.first);
      if (varname.substr(0, 3) == "#%q")
        {
        std::stringstream ss;
        ss << varname.substr(3);
        uint64_t ind;
        ss >> ind;
        for (const auto& q : rd.quote_to_index)
          {
          if (q.second == ind)
            {
            out << "(quote " << q.first << ")\n";
            }
          }
        }
      else
        out << varname << "\n";
      }
    }
  }